

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt.cpp
# Opt level: O2

void rt_Translate4cols(BYTE *translation,int yl,int yh)

{
  BYTE BVar1;
  BYTE *pBVar2;
  long lVar3;
  int iVar4;
  
  pBVar2 = dc_temp;
  iVar4 = yl << 2;
  for (lVar3 = 0; (int)((yh - yl) + 1U) >> 1 != (int)lVar3; lVar3 = lVar3 + 1) {
    BVar1 = translation[pBVar2[lVar3 * 8 + (long)iVar4 + 1]];
    pBVar2[lVar3 * 8 + (long)iVar4] = translation[pBVar2[lVar3 * 8 + (long)iVar4]];
    pBVar2[lVar3 * 8 + (long)iVar4 + 1] = BVar1;
    BVar1 = translation[pBVar2[lVar3 * 8 + (long)iVar4 + 3]];
    pBVar2[lVar3 * 8 + (long)iVar4 + 2] = translation[pBVar2[lVar3 * 8 + (long)iVar4 + 2]];
    pBVar2[lVar3 * 8 + (long)iVar4 + 3] = BVar1;
    BVar1 = translation[pBVar2[lVar3 * 8 + (long)iVar4 + 5]];
    pBVar2[lVar3 * 8 + (long)iVar4 + 4] = translation[pBVar2[lVar3 * 8 + (long)iVar4 + 4]];
    pBVar2[lVar3 * 8 + (long)iVar4 + 5] = BVar1;
    BVar1 = translation[pBVar2[lVar3 * 8 + (long)iVar4 + 7]];
    pBVar2[lVar3 * 8 + (long)iVar4 + 6] = translation[pBVar2[lVar3 * 8 + (long)iVar4 + 6]];
    pBVar2[lVar3 * 8 + (long)iVar4 + 7] = BVar1;
  }
  if ((yh - yl & 1U) == 0) {
    BVar1 = translation[pBVar2[lVar3 * 8 + (long)iVar4 + 1]];
    pBVar2[lVar3 * 8 + (long)iVar4] = translation[pBVar2[lVar3 * 8 + (long)iVar4]];
    pBVar2[lVar3 * 8 + (long)iVar4 + 1] = BVar1;
    BVar1 = translation[pBVar2[lVar3 * 8 + (long)iVar4 + 3]];
    pBVar2[lVar3 * 8 + (long)iVar4 + 2] = translation[pBVar2[lVar3 * 8 + (long)iVar4 + 2]];
    pBVar2[lVar3 * 8 + (long)iVar4 + 3] = BVar1;
  }
  return;
}

Assistant:

void rt_Translate4cols(const BYTE *translation, int yl, int yh)
{
	int count = yh - yl + 1;
	BYTE *source = &dc_temp[yl*4];
	int c0, c1;
	BYTE b0, b1;

	// Do 2 rows at a time.
	for (int count8 = count >> 1; count8; --count8)
	{
		c0 = source[0];			c1 = source[1];
		b0 = translation[c0];	b1 = translation[c1];
		source[0] = b0;			source[1] = b1;

		c0 = source[2];			c1 = source[3];
		b0 = translation[c0];	b1 = translation[c1];
		source[2] = b0;			source[3] = b1;

		c0 = source[4];			c1 = source[5];
		b0 = translation[c0];	b1 = translation[c1];
		source[4] = b0;			source[5] = b1;

		c0 = source[6];			c1 = source[7];
		b0 = translation[c0];	b1 = translation[c1];
		source[6] = b0;			source[7] = b1;

		source += 8;
	}
	// Do the final row if count was odd.
	if (count & 1)
	{
		c0 = source[0];			c1 = source[1];
		b0 = translation[c0];	b1 = translation[c1];
		source[0] = b0;			source[1] = b1;

		c0 = source[2];			c1 = source[3];
		b0 = translation[c0];	b1 = translation[c1];
		source[2] = b0;			source[3] = b1;
	}
}